

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_nameLength(ENCODING *enc,char *ptr)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  
  iVar2 = (int)ptr;
  do {
    bVar1 = *ptr;
    if (bVar1 < 0xdc) {
      bVar3 = 2;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar3 = *(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]) - 5;
        }
        else {
LAB_00184a41:
          bVar3 = 0x18;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar3 = 3;
    }
    else if ((bVar1 != 0xff) || (bVar3 = 0xfb, ((byte *)ptr)[1] < 0xfe)) goto LAB_00184a41;
    if ((0x18 < bVar3) || ((0x17e0007U >> (bVar3 & 0x1f) & 1) == 0)) {
      return (int)ptr - iVar2;
    }
    ptr = (char *)((byte *)ptr + *(long *)(&DAT_001ae3c8 + (ulong)bVar3 * 8));
  } while( true );
}

Assistant:

PREFIX(nameLength)(const ENCODING *enc, const char *ptr) {
  const char *start = ptr;
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
#  ifdef XML_NS
    case BT_COLON:
#  endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      ptr += MINBPC(enc);
      break;
    default:
      return (int)(ptr - start);
    }
  }
}